

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerResults.cpp
# Opt level: O0

void __thiscall
I2cAnalyzerResults::GenerateExportFile
          (I2cAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ulonglong uVar5;
  ostream *poVar6;
  ulong uVar7;
  uchar *puVar8;
  bool bVar9;
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  ulonglong local_540;
  U64 packet_id;
  char ack_1 [32];
  char data [128];
  char time_1 [128];
  string local_3f8 [32];
  string local_3d8 [32];
  char local_3b8 [8];
  char time [128];
  char ack [32];
  ulonglong local_310;
  Frame frame;
  ulong local_300;
  char local_2f0;
  byte local_2ef;
  uint local_2e4;
  U32 i;
  U64 num_frames;
  char rw [128];
  char address [128];
  U32 sample_rate;
  U64 trigger_sample;
  void *f;
  stringstream ss;
  ostream local_198 [376];
  U32 local_20;
  DisplayBase local_1c;
  U32 param_3_local;
  DisplayBase display_base_local;
  char *file_local;
  I2cAnalyzerResults *this_local;
  
  local_20 = param_3;
  local_1c = display_base;
  _param_3_local = file;
  file_local = (char *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&f);
  pvVar4 = (void *)AnalyzerHelpers::StartFile(_param_3_local,false);
  uVar5 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  poVar6 = std::operator<<(local_198,"Time [s],Packet ID,Address,Data,Read/Write,ACK/NAK");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  rw[0x78] = '\0';
  rw[0x79] = '\0';
  rw[0x7a] = '\0';
  rw[0x7b] = '\0';
  rw[0x7c] = '\0';
  rw[0x7d] = '\0';
  rw[0x7e] = '\0';
  rw[0x7f] = '\0';
  rw[0x68] = '\0';
  rw[0x69] = '\0';
  rw[0x6a] = '\0';
  rw[0x6b] = '\0';
  rw[0x6c] = '\0';
  rw[0x6d] = '\0';
  rw[0x6e] = '\0';
  rw[0x6f] = '\0';
  rw[0x70] = '\0';
  rw[0x71] = '\0';
  rw[0x72] = '\0';
  rw[0x73] = '\0';
  rw[0x74] = '\0';
  rw[0x75] = '\0';
  rw[0x76] = '\0';
  rw[0x77] = '\0';
  rw[0x58] = '\0';
  rw[0x59] = '\0';
  rw[0x5a] = '\0';
  rw[0x5b] = '\0';
  rw[0x5c] = '\0';
  rw[0x5d] = '\0';
  rw[0x5e] = '\0';
  rw[0x5f] = '\0';
  rw[0x60] = '\0';
  rw[0x61] = '\0';
  rw[0x62] = '\0';
  rw[99] = '\0';
  rw[100] = '\0';
  rw[0x65] = '\0';
  rw[0x66] = '\0';
  rw[0x67] = '\0';
  rw[0x48] = '\0';
  rw[0x49] = '\0';
  rw[0x4a] = '\0';
  rw[0x4b] = '\0';
  rw[0x4c] = '\0';
  rw[0x4d] = '\0';
  rw[0x4e] = '\0';
  rw[0x4f] = '\0';
  rw[0x50] = '\0';
  rw[0x51] = '\0';
  rw[0x52] = '\0';
  rw[0x53] = '\0';
  rw[0x54] = '\0';
  rw[0x55] = '\0';
  rw[0x56] = '\0';
  rw[0x57] = '\0';
  rw[0x38] = '\0';
  rw[0x39] = '\0';
  rw[0x3a] = '\0';
  rw[0x3b] = '\0';
  rw[0x3c] = '\0';
  rw[0x3d] = '\0';
  rw[0x3e] = '\0';
  rw[0x3f] = '\0';
  rw[0x40] = '\0';
  rw[0x41] = '\0';
  rw[0x42] = '\0';
  rw[0x43] = '\0';
  rw[0x44] = '\0';
  rw[0x45] = '\0';
  rw[0x46] = '\0';
  rw[0x47] = '\0';
  rw[0x28] = '\0';
  rw[0x29] = '\0';
  rw[0x2a] = '\0';
  rw[0x2b] = '\0';
  rw[0x2c] = '\0';
  rw[0x2d] = '\0';
  rw[0x2e] = '\0';
  rw[0x2f] = '\0';
  rw[0x30] = '\0';
  rw[0x31] = '\0';
  rw[0x32] = '\0';
  rw[0x33] = '\0';
  rw[0x34] = '\0';
  rw[0x35] = '\0';
  rw[0x36] = '\0';
  rw[0x37] = '\0';
  rw[0x18] = '\0';
  rw[0x19] = '\0';
  rw[0x1a] = '\0';
  rw[0x1b] = '\0';
  rw[0x1c] = '\0';
  rw[0x1d] = '\0';
  rw[0x1e] = '\0';
  rw[0x1f] = '\0';
  rw[0x20] = '\0';
  rw[0x21] = '\0';
  rw[0x22] = '\0';
  rw[0x23] = '\0';
  rw[0x24] = '\0';
  rw[0x25] = '\0';
  rw[0x26] = '\0';
  rw[0x27] = '\0';
  rw[8] = '\0';
  rw[9] = '\0';
  rw[10] = '\0';
  rw[0xb] = '\0';
  rw[0xc] = '\0';
  rw[0xd] = '\0';
  rw[0xe] = '\0';
  rw[0xf] = '\0';
  rw[0x10] = '\0';
  rw[0x11] = '\0';
  rw[0x12] = '\0';
  rw[0x13] = '\0';
  rw[0x14] = '\0';
  rw[0x15] = '\0';
  rw[0x16] = '\0';
  rw[0x17] = '\0';
  num_frames = 0;
  rw[0] = '\0';
  rw[1] = '\0';
  rw[2] = '\0';
  rw[3] = '\0';
  rw[4] = '\0';
  rw[5] = '\0';
  rw[6] = '\0';
  rw[7] = '\0';
  uVar7 = AnalyzerResults::GetNumFrames();
  for (local_2e4 = 0; local_2e4 < uVar7; local_2e4 = local_2e4 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&local_310);
    if (local_2f0 == '\0') {
      AnalyzerHelpers::GetNumberString(local_300 >> 1,local_1c,7,rw + 0x78,0x80);
      if ((local_300 & 1) == 0) {
        snprintf((char *)&num_frames,0x80,"Write");
      }
      else {
        snprintf((char *)&num_frames,0x80,"Read");
      }
      if ((local_2ef & 1) == 0) {
        if ((local_2ef & 2) == 0) {
          snprintf(time + 0x78,0x20,"NAK");
        }
        else {
          snprintf(time + 0x78,0x20,"Missing ACK/NAK");
        }
        AnalyzerHelpers::GetTimeString(local_310,uVar5,uVar2,local_3b8,0x80);
        poVar6 = std::operator<<(local_198,local_3b8);
        poVar6 = std::operator<<(poVar6,",,");
        poVar6 = std::operator<<(poVar6,rw + 0x78);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,"");
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,(char *)&num_frames);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,time + 0x78);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        puVar8 = (uchar *)std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        uVar3 = std::__cxx11::string::length();
        AnalyzerHelpers::AppendToFile(puVar8,uVar3,pvVar4);
        std::__cxx11::string::~string(local_3f8);
        std::__cxx11::string::~string(local_3d8);
        std::__cxx11::string::string((string *)(time_1 + 0x78));
        std::__cxx11::stringstream::str((string *)&f);
        std::__cxx11::string::~string((string *)(time_1 + 0x78));
      }
    }
    else {
      AnalyzerHelpers::GetTimeString(local_310,uVar5,uVar2,data + 0x78,0x80);
      AnalyzerHelpers::GetNumberString(local_300,local_1c,8,ack_1 + 0x18,0x80);
      if ((local_2ef & 1) == 0) {
        if ((local_2ef & 2) == 0) {
          snprintf((char *)&packet_id,0x20,"NAK");
        }
        else {
          snprintf((char *)&packet_id,0x20,"Missing ACK/NAK");
        }
      }
      else {
        snprintf((char *)&packet_id,0x20,"ACK");
      }
      local_540 = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
      if (local_540 == 0xffffffffffffffff) {
        poVar6 = std::operator<<(local_198,data + 0x78);
        poVar6 = std::operator<<(poVar6,",,");
        poVar6 = std::operator<<(poVar6,rw + 0x78);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,ack_1 + 0x18);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,(char *)&num_frames);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,(char *)&packet_id);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar6 = std::operator<<(local_198,data + 0x78);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_540);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,rw + 0x78);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,ack_1 + 0x18);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,(char *)&num_frames);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,(char *)&packet_id);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    std::__cxx11::stringstream::str();
    puVar8 = (uchar *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    uVar3 = std::__cxx11::string::length();
    AnalyzerHelpers::AppendToFile(puVar8,uVar3,pvVar4);
    std::__cxx11::string::~string(local_580);
    std::__cxx11::string::~string(local_560);
    std::__cxx11::string::string(local_5a0);
    std::__cxx11::stringstream::str((string *)&f);
    std::__cxx11::string::~string(local_5a0);
    bVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)local_2e4)
    ;
    bVar9 = (bVar1 & 1) == 1;
    if (bVar9) {
      AnalyzerHelpers::EndFile(pvVar4);
    }
    Frame::~Frame((Frame *)&local_310);
    if (bVar9) goto LAB_0010b392;
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
  AnalyzerHelpers::EndFile(pvVar4);
LAB_0010b392:
  std::__cxx11::stringstream::~stringstream((stringstream *)&f);
  return;
}

Assistant:

void I2cAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    // export_type_user_id is only important if we have more than one export type.

    std::stringstream ss;
    void* f = AnalyzerHelpers::StartFile( file );
    ;

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    ss << "Time [s],Packet ID,Address,Data,Read/Write,ACK/NAK" << std::endl;

    char address[ 128 ] = "";
    char rw[ 128 ] = "";
    U64 num_frames = GetNumFrames();
    for( U32 i = 0; i < num_frames; i++ )
    {
        Frame frame = GetFrame( i );

        if( frame.mType == I2cAddress )
        {
            AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, address, 128 );
            if( ( frame.mData1 & 0x1 ) != 0 )
                snprintf( rw, sizeof( rw ), "Read" );
            else
                snprintf( rw, sizeof( rw ), "Write" );

            // check to see if the address packet is NAKed. If it is, we need to export the line here.
            if( ( frame.mFlags & I2C_FLAG_ACK ) == 0 )
            {
                char ack[ 32 ];
                if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
                    snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
                else
                    snprintf( ack, sizeof( ack ), "NAK" );
                // we need to write out the line here.
                char time[ 128 ];
                AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time, 128 );

                ss << time << ",," << address << ","
                   << ""
                   << "," << rw << "," << ack << std::endl;
                AnalyzerHelpers::AppendToFile( ( U8* )ss.str().c_str(), ss.str().length(), f );
                ss.str( std::string() );
            }
        }
        else
        {
            char time[ 128 ];
            AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time, 128 );

            char data[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, data, 128 );

            char ack[ 32 ];
            if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
                snprintf( ack, sizeof( ack ), "ACK" );
            else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
                snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
            else
                snprintf( ack, sizeof( ack ), "NAK" );


            U64 packet_id = GetPacketContainingFrameSequential( i );
            if( packet_id != INVALID_RESULT_INDEX )
                ss << time << "," << packet_id << "," << address << "," << data << "," << rw << "," << ack << std::endl;
            else
                ss << time << ",," << address << "," << data << "," << rw << "," << ack << std::endl;
        }

        AnalyzerHelpers::AppendToFile( ( U8* )ss.str().c_str(), ss.str().length(), f );
        ss.str( std::string() );


        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            AnalyzerHelpers::EndFile( f );
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
    AnalyzerHelpers::EndFile( f );
}